

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,IO *this,istream *is,
          unsigned_long num_entries)

{
  allocator<int> local_22;
  undefined1 local_21;
  istream *local_20;
  unsigned_long num_entries_local;
  istream *is_local;
  vector<int,_std::allocator<int>_> *x;
  
  local_21 = 0;
  local_20 = is;
  num_entries_local = (unsigned_long)this;
  is_local = (istream *)__return_storage_ptr__;
  ::std::allocator<int>::allocator(&local_22);
  ::std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,(size_type)is,&local_22);
  ::std::allocator<int>::~allocator(&local_22);
  readVector<TasGrid::IO::mode_ascii_type,int>((istream *)num_entries_local,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<VecType> readVector(std::istream &is, SizeType num_entries){
    std::vector<VecType> x((size_t) num_entries);
    readVector<iomode, VecType>(is, x);
    return x;
}